

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O2

void __thiscall QHttpThreadDelegate::synchronousFinishedSlot(QHttpThreadDelegate *this)

{
  QArrayDataPointer<char16_t> *this_00;
  undefined1 *puVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  QHttpThreadDelegate QVar4;
  int iVar5;
  NetworkError NVar6;
  qsizetype qVar7;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QArrayDataPointer<char16_t> local_b0;
  undefined1 local_98 [32];
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(QHttpNetworkReply **)(this + 0x150) != (QHttpNetworkReply *)0x0) {
    iVar5 = QHttpNetworkReply::statusCode(*(QHttpNetworkReply **)(this + 0x150));
    if (399 < iVar5) {
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      qVar7 = QtPrivate::lengthHelperPointer<char>("Error transferring %1 - server replied: %2");
      latin1.m_data = "Error transferring %1 - server replied: %2";
      latin1.m_size = qVar7;
      QString::QString((QString *)&local_58,latin1);
      QHttpNetworkRequest::url((QHttpNetworkRequest *)local_98);
      this_00 = (QArrayDataPointer<char16_t> *)(local_98 + 8);
      QUrl::toString(this_00,(QHttpNetworkRequest *)local_98,0);
      QHttpNetworkReply::reasonPhrase((QString *)&local_b0,*(QHttpNetworkReply **)(this + 0x150));
      QString::arg<QString,QString>
                ((type *)&local_78,(QString *)&local_58,(QString *)this_00,(QString *)&local_b0);
      pDVar2 = *(Data **)(this + 0xf8);
      pcVar3 = *(char16_t **)(this + 0x100);
      *(Data **)(this + 0xf8) = local_78.d;
      *(char16_t **)(this + 0x100) = local_78.ptr;
      qVar7 = *(qsizetype *)(this + 0x108);
      *(qsizetype *)(this + 0x108) = local_78.size;
      local_78.d = pDVar2;
      local_78.ptr = pcVar3;
      local_78.size = qVar7;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
      QUrl::~QUrl((QUrl *)local_98);
      iVar5 = QHttpNetworkReply::statusCode(*(QHttpNetworkReply **)(this + 0x150));
      QHttpNetworkRequest::url((QHttpNetworkRequest *)&local_78);
      NVar6 = statusCodeFromHttp(iVar5,(QUrl *)&local_78);
      *(NetworkError *)(this + 0xf0) = NVar6;
      QUrl::~QUrl((QUrl *)&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    }
    QVar4 = (QHttpThreadDelegate)
            QHttpNetworkReply::isCompressed(*(QHttpNetworkReply **)(this + 0x150));
    this[0xda] = QVar4;
    QHttpNetworkReply::readAll((QByteArray *)&local_58,*(QHttpNetworkReply **)(this + 0x150));
    pDVar2 = *(Data **)(this + 0x98);
    pcVar3 = *(char16_t **)(this + 0xa0);
    *(Data **)(this + 0x98) = local_58.d;
    *(char16_t **)(this + 0xa0) = local_58.ptr;
    puVar1 = *(undefined1 **)(this + 0xa8);
    *(qsizetype *)(this + 0xa8) = local_58.size;
    local_58.d = pDVar2;
    local_58.ptr = pcVar3;
    local_58.size = (qsizetype)puVar1;
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
    QMetaObject::invokeMethod<>(*(QObject **)(this + 0x150),"deleteLater",QueuedConnection);
    QMetaObject::invokeMethod<>(*(QObject **)(this + 0x158),"quit",QueuedConnection);
    *(undefined8 *)(this + 0x150) = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpThreadDelegate::synchronousFinishedSlot()
{
    if (!httpReply)
        return;

#ifdef QHTTPTHREADDELEGATE_DEBUG
    qDebug() << "QHttpThreadDelegate::synchronousFinishedSlot() thread=" << QThread::currentThreadId() << "result=" << httpReply->statusCode();
#endif
    if (httpReply->statusCode() >= 400) {
            // it's an error reply
            QString msg = QLatin1StringView(QT_TRANSLATE_NOOP("QNetworkReply",
                                                              "Error transferring %1 - server replied: %2"));
            incomingErrorDetail = msg.arg(httpRequest.url().toString(), httpReply->reasonPhrase());
            incomingErrorCode = statusCodeFromHttp(httpReply->statusCode(), httpRequest.url());
    }

    isCompressed = httpReply->isCompressed();
    synchronousDownloadData = httpReply->readAll();

    QMetaObject::invokeMethod(httpReply, "deleteLater", Qt::QueuedConnection);
    QMetaObject::invokeMethod(synchronousRequestLoop, "quit", Qt::QueuedConnection);
    httpReply = nullptr;
}